

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

void __thiscall spv::Builder::dumpSourceInstructions(Builder *this,Vector<unsigned_int> *out)

{
  size_type sVar1;
  char *pcVar2;
  undefined1 local_e8 [8];
  Instruction sourceContinuedInst;
  undefined1 local_90 [8];
  String subString;
  int nextByte;
  undefined1 local_60 [8];
  Instruction sourceInst;
  int nonNullBytesPerInstruction;
  int opSourceWordCount;
  int maxWordCount;
  Vector<unsigned_int> *out_local;
  Builder *this_local;
  
  sourceInst.block._4_4_ = 0x3ffeb;
  if (this->source != SourceLanguageUnknown) {
    Instruction::Instruction((Instruction *)local_60,0,0,OpSource);
    Instruction::addImmediateOperand((Instruction *)local_60,this->source);
    Instruction::addImmediateOperand((Instruction *)local_60,this->sourceVersion);
    if (this->sourceFileStringId == 0) {
      Instruction::dump((Instruction *)local_60,out);
    }
    else {
      Instruction::addIdOperand((Instruction *)local_60,this->sourceFileStringId);
      sVar1 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
              size(&this->sourceText);
      if (sVar1 == 0) {
        Instruction::dump((Instruction *)local_60,out);
      }
      else {
        subString.field_2._8_4_ = 0;
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                      *)local_90);
        while (sVar1 = std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                       ::size(&this->sourceText), 0 < (int)sVar1 - subString.field_2._8_4_) {
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::substr
                    ((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                      *)&sourceContinuedInst.block,&this->sourceText,SEXT48(subString.field_2._8_4_)
                     ,0x3ffeb);
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          operator=((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                     *)local_90,
                    (basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                     *)&sourceContinuedInst.block);
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          ~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                         *)&sourceContinuedInst.block);
          if (subString.field_2._8_4_ == 0) {
            pcVar2 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                     ::c_str((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                              *)local_90);
            Instruction::addStringOperand((Instruction *)local_60,pcVar2);
            Instruction::dump((Instruction *)local_60,out);
          }
          else {
            Instruction::Instruction((Instruction *)local_e8,OpSourceContinued);
            pcVar2 = std::__cxx11::
                     basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                     ::c_str((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                              *)local_90);
            Instruction::addStringOperand((Instruction *)local_e8,pcVar2);
            Instruction::dump((Instruction *)local_e8,out);
            Instruction::~Instruction((Instruction *)local_e8);
          }
          subString.field_2._8_4_ = subString.field_2._8_4_ + 0x3ffeb;
        }
        std::__cxx11::
        basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
        ~basic_string((basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>
                       *)local_90);
      }
    }
    Instruction::~Instruction((Instruction *)local_60);
  }
  return;
}

Assistant:

void Builder::dumpSourceInstructions(dxil_spv::Vector<unsigned int>& out) const
{
    const int maxWordCount = 0xFFFF;
    const int opSourceWordCount = 4;
    const int nonNullBytesPerInstruction = 4 * (maxWordCount - opSourceWordCount) - 1;

    if (source != SourceLanguageUnknown) {
        // OpSource Language Version File Source
        Instruction sourceInst(NoResult, NoType, OpSource);
        sourceInst.addImmediateOperand(source);
        sourceInst.addImmediateOperand(sourceVersion);
        // File operand
        if (sourceFileStringId != NoResult) {
            sourceInst.addIdOperand(sourceFileStringId);
            // Source operand
            if (sourceText.size() > 0) {
                int nextByte = 0;
                dxil_spv::String subString;
                while ((int)sourceText.size() - nextByte > 0) {
                    subString = sourceText.substr(nextByte, nonNullBytesPerInstruction);
                    if (nextByte == 0) {
                        // OpSource
                        sourceInst.addStringOperand(subString.c_str());
                        sourceInst.dump(out);
                    } else {
                        // OpSourcContinued
                        Instruction sourceContinuedInst(OpSourceContinued);
                        sourceContinuedInst.addStringOperand(subString.c_str());
                        sourceContinuedInst.dump(out);
                    }
                    nextByte += nonNullBytesPerInstruction;
                }
            } else
                sourceInst.dump(out);
        } else
            sourceInst.dump(out);
    }
}